

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_store(CompilerHLSL *this,Instruction *instruction)

{
  uint32_t *puVar1;
  SPIRExpression *pSVar2;
  SPIRAccessChain *chain;
  string lhs;
  string rhs;
  
  puVar1 = Compiler::stream((Compiler *)this,instruction);
  if ((((this->super_CompilerGLSL).options.vertex.flip_vert_y == true) &&
      (pSVar2 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,*puVar1),
      pSVar2 != (SPIRExpression *)0x0)) && (pSVar2->access_meshlet_position_y == true)) {
    CompilerGLSL::to_dereferenced_expression_abi_cxx11_(&lhs,&this->super_CompilerGLSL,*puVar1,true)
    ;
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&rhs,&this->super_CompilerGLSL,puVar1[1],true);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[17],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,&lhs,(char (*) [17])" = spvFlipVertY(",&rhs,
               (char (*) [3])0x39d4ef);
    Compiler::register_write((Compiler *)this,*puVar1);
    ::std::__cxx11::string::~string((string *)&rhs);
    ::std::__cxx11::string::~string((string *)&lhs);
    return;
  }
  chain = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,*puVar1);
  if (chain != (SPIRAccessChain *)0x0) {
    lhs._M_dataplus._M_p = (pointer)((long)&lhs.field_2 + 8);
    lhs._M_string_length = 0;
    lhs.field_2._M_allocated_capacity = 8;
    write_access_chain(this,chain,puVar1[1],(SmallVector<unsigned_int,_8UL> *)&lhs);
    SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&lhs);
    return;
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_store(const Instruction &instruction)
{
	auto ops = stream(instruction);
	if (options.vertex.flip_vert_y)
	{
		auto *expr = maybe_get<SPIRExpression>(ops[0]);
		if (expr != nullptr && expr->access_meshlet_position_y)
		{
			auto lhs = to_dereferenced_expression(ops[0]);
			auto rhs = to_unpacked_expression(ops[1]);
			statement(lhs, " = spvFlipVertY(", rhs, ");");
			register_write(ops[0]);
			return;
		}
	}

	auto *chain = maybe_get<SPIRAccessChain>(ops[0]);
	if (chain)
		write_access_chain(*chain, ops[1], {});
	else
		CompilerGLSL::emit_instruction(instruction);
}